

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

char * __thiscall Fl_Text_Buffer::text_range(Fl_Text_Buffer *this,int start,int end)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *__dest;
  int iVar4;
  uint uVar5;
  
  if ((start < 0) || (uVar1 = this->mLength, (int)uVar1 < start)) {
    pcVar3 = (char *)malloc(1);
    __dest = pcVar3;
    goto LAB_001cad7d;
  }
  uVar5 = start;
  if (start < end) {
    uVar5 = end;
  }
  if (end < start) {
    start = end;
  }
  if (uVar1 <= uVar5) {
    uVar5 = uVar1;
  }
  iVar4 = uVar5 - start;
  __dest = (char *)malloc((long)(iVar4 + 1));
  iVar2 = this->mGapStart;
  if (iVar2 < (int)uVar5) {
    if (iVar2 <= start) {
      pcVar3 = this->mBuf + ((long)this->mGapEnd - (long)iVar2) + (long)start;
      goto LAB_001cad69;
    }
    iVar2 = iVar2 - start;
    pcVar3 = this->mBuf;
    memcpy(__dest,pcVar3 + start,(long)iVar2);
    memcpy(__dest + iVar2,pcVar3 + this->mGapEnd,(long)(iVar4 - iVar2));
  }
  else {
    pcVar3 = this->mBuf + start;
LAB_001cad69:
    memcpy(__dest,pcVar3,(long)iVar4);
  }
  pcVar3 = __dest + iVar4;
LAB_001cad7d:
  *pcVar3 = '\0';
  return __dest;
}

Assistant:

char *Fl_Text_Buffer::text_range(int start, int end) const {
  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  
  char *s = NULL;
  
  /* Make sure start and end are ok, and allocate memory for returned string.
   If start is bad, return "", if end is bad, adjust it. */
  if (start < 0 || start > mLength)
  {
    s = (char *) malloc(1);
    s[0] = '\0';
    return s;
  }
  if (end < start) {
    int temp = start;
    start = end;
    end = temp;
  }
  if (end > mLength)
    end = mLength;
  int copiedLength = end - start;
  s = (char *) malloc(copiedLength + 1);
  
  /* Copy the text from the buffer to the returned string */
  if (end <= mGapStart) {
    memcpy(s, mBuf + start, copiedLength);
  } else if (start >= mGapStart) {
    memcpy(s, mBuf + start + (mGapEnd - mGapStart), copiedLength);
  } else {
    int part1Length = mGapStart - start;
    memcpy(s, mBuf + start, part1Length);
    memcpy(s + part1Length, mBuf + mGapEnd, copiedLength - part1Length);
  }
  s[copiedLength] = '\0';
  return s;
}